

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_utilities.c
# Opt level: O3

wchar_t UnicodeUtilities_print_wide_character_to_utf8_buffer
                  (uchar *buffer,wchar_t *text,wchar_t pos)

{
  undefined8 in_RAX;
  Utf8Bytes utf8_bytes;
  Utf8Bytes local_16;
  
  local_16.byte_count = (uchar)((ulong)in_RAX >> 0x10);
  write_utf8_bytes_for_code_point(&local_16,(long)text[pos]);
  if ((ulong)local_16.byte_count != 0) {
    memcpy(buffer,local_16.bytes,(ulong)local_16.byte_count);
  }
  return (wchar_t)local_16.byte_count;
}

Assistant:

int UnicodeUtilities_print_wide_character_to_utf8_buffer(unsigned char* buffer, const wchar_t* text, int pos) {
    long code_point;
    if (!UnicodeUtilities_is_utf16_surrogate(text[pos]) || sizeof(wchar_t) > 2) {
        code_point = (long)text[pos];
    } else {
        code_point = get_code_point_from_utf16_surrogate(text, pos++);
    }
    Utf8Bytes utf8_bytes;
    write_utf8_bytes_for_code_point(&utf8_bytes, code_point);
    print_code_point_to_utf8_buffer(buffer, &utf8_bytes);
    return utf8_bytes.byte_count;
}